

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

void __thiscall PointBlock<3U>::print_block(PointBlock<3U> *this,ProxyWithLink *cp,bool verbose)

{
  size_type sVar1;
  byte in_DL;
  Proxy *in_RSI;
  char (*in_RDI) [6];
  int *unaff_retaddr;
  char (*in_stack_00000008) [17];
  DynamicPoint<float,_4UL> *in_stack_00000010;
  DynamicPoint<float,_4UL> *in_stack_00000018;
  size_t i;
  char (*in_stack_00000028) [23];
  ulong local_28;
  char (*format_str) [6];
  
  format_str = in_RDI;
  diy::Master::Proxy::gid(in_RSI);
  fmt::v7::print<char[23],int,diy::DynamicPoint<float,4ul>&,diy::DynamicPoint<float,4ul>&,char>
            (in_stack_00000028,(int *)i,in_stack_00000018,in_stack_00000010);
  diy::Master::Proxy::gid(in_RSI);
  fmt::v7::print<char[23],int,diy::DynamicPoint<float,4ul>&,diy::DynamicPoint<float,4ul>&,char>
            (in_stack_00000028,(int *)i,in_stack_00000018,in_stack_00000010);
  if ((in_DL & 1) == 0) {
    diy::Master::Proxy::gid(in_RSI);
    Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size
              ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
               (in_RDI[0x2a] + 4));
    fmt::v7::print<char[17],int,unsigned_long,char>
              (in_stack_00000008,unaff_retaddr,(unsigned_long *)format_str);
  }
  else {
    for (local_28 = 0;
        sVar1 = Catch::clara::std::
                vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size
                          ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *
                           )(in_RDI[0x2a] + 4)), local_28 < sVar1; local_28 = local_28 + 1) {
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      operator[]((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 (in_RDI[0x2a] + 4),local_28);
      fmt::v7::print<char[6],diy::Point<float,3u>&,char>(format_str,(Point<float,_3U> *)in_RSI);
    }
  }
  return;
}

Assistant:

void          print_block(const diy::Master::ProxyWithLink& cp,  // communication proxy
                              bool verbose)                          // amount of output
    {
        fmt::print("[{}] Box:    {} -- {}\n", cp.gid(), box.min, box.max);
        fmt::print("[{}] Bounds: {} -- {}\n", cp.gid(), bounds.min, bounds.max);

        if (verbose)
        {
            for (size_t i = 0; i < points.size(); ++i)
                fmt::print("  {}\n", points[i]);
        } else
            fmt::print("[{}] Points: {}\n", cp.gid(), points.size());
    }